

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall ACSStringPool::PurgeStrings(ACSStringPool *this)

{
  uint uVar1;
  PoolEntry *this_00;
  uint h;
  PoolEntry *entry;
  uint i;
  size_t freedcount;
  size_t usedcount;
  ACSStringPool *this_local;
  
  memset(this->PoolBuckets,0xff,0x3ec);
  for (entry._4_4_ = 0;
      uVar1 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Size(&this->Pool),
      entry._4_4_ < uVar1; entry._4_4_ = entry._4_4_ + 1) {
    this_00 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                        (&this->Pool,(ulong)entry._4_4_);
    if (this_00->Next != 0xfffffffe) {
      if (this_00->LockCount == 0) {
        this_00->Next = 0xfffffffe;
        if (entry._4_4_ < this->FirstFreeEntry) {
          this->FirstFreeEntry = entry._4_4_;
        }
        FString::operator=(&this_00->Str,"");
      }
      else {
        uVar1 = this_00->Hash % 0xfb;
        this_00->Next = this->PoolBuckets[uVar1];
        this->PoolBuckets[uVar1] = entry._4_4_;
        this_00->LockCount = this_00->LockCount & 0x7fffffff;
      }
    }
  }
  return;
}

Assistant:

void ACSStringPool::PurgeStrings()
{
	// Clear the hash buckets. We'll rebuild them as we decide what strings
	// to keep and which to toss.
	memset(PoolBuckets, 0xFF, sizeof(PoolBuckets));
	size_t usedcount = 0, freedcount = 0;
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		PoolEntry *entry = &Pool[i];
		if (entry->Next != FREE_ENTRY)
		{
			if (entry->LockCount == 0)
			{
				freedcount++;
				// Mark this entry as free.
				entry->Next = FREE_ENTRY;
				if (i < FirstFreeEntry)
				{
					FirstFreeEntry = i;
				}
				// And free the string.
				entry->Str = "";
			}
			else
			{
				usedcount++;
				// Rehash this entry.
				unsigned int h = entry->Hash % NUM_BUCKETS;
				entry->Next = PoolBuckets[h];
				PoolBuckets[h] = i;
				// Remove MarkString's mark.
				entry->LockCount &= 0x7FFFFFFF;
			}
		}
	}
}